

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Gia_ManTestDistanceInternal(Emb_Man_t *p)

{
  Emb_Obj_t *pEVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  timespec ts;
  timespec local_38;
  
  Gia_ManRandom(1);
  if (0 < p->nObjData) {
    uVar3 = 0;
    do {
      piVar2 = p->pObjData;
      if (piVar2 == (int *)0x0) break;
      piVar2[(ulong)uVar3 + 3] = 0;
      uVar3 = piVar2[(ulong)uVar3 + 1] + ((uint)piVar2[uVar3] >> 4) + uVar3 + 5;
    } while ((int)uVar3 < p->nObjData);
  }
  p->nTravIds = 1;
  iVar4 = clock_gettime(3,&local_38);
  if (iVar4 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  printf("From inputs: ");
  iVar4 = 0;
  do {
    iVar10 = 0;
    uVar5 = Gia_ManRandom(0);
    uVar3 = p->vCis->nSize;
    uVar6 = (ulong)uVar5 % (ulong)uVar3;
    iVar7 = (int)uVar6;
    if ((iVar7 < 0) || ((int)uVar3 <= iVar7)) goto LAB_0072280f;
    uVar6 = (ulong)(uint)p->vCis->pArray[uVar6];
    if ((p->pObjData[uVar6 + 1] != 0) &&
       (pEVar1 = (Emb_Obj_t *)(p->pObjData + uVar6),
       0xf < *(uint *)(&pEVar1->field_0x0 +
                      (long)*(int *)(&pEVar1[1].field_0x0 + (ulong)(*(uint *)pEVar1 >> 4) * 4) * 4)
       && (*(uint *)(&pEVar1->field_0x0 +
                    (long)*(int *)(&pEVar1[1].field_0x0 + (ulong)(*(uint *)pEVar1 >> 4) * 4) * 4) &
          3) == 0)) {
      uVar3 = Emb_ManComputeDistance_old(p,pEVar1);
      iVar10 = 0xabd2aa;
      printf("%d ",(ulong)uVar3);
      iVar4 = iVar4 + 1;
    }
  } while (iVar4 < 0x14);
  Abc_Print(iVar10,"%s =","Time");
  iVar7 = 3;
  iVar4 = clock_gettime(3,&local_38);
  if (iVar4 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
  iVar4 = clock_gettime(3,&local_38);
  if (iVar4 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  printf("From outputs: ");
  iVar4 = 0;
  while( true ) {
    iVar10 = 0;
    uVar5 = Gia_ManRandom(0);
    uVar3 = p->vCos->nSize;
    uVar6 = (ulong)uVar5 % (ulong)uVar3;
    iVar7 = (int)uVar6;
    if ((iVar7 < 0) || ((int)uVar3 <= iVar7)) break;
    pEVar1 = (Emb_Obj_t *)(p->pObjData + (uint)p->vCos->pArray[uVar6]);
    uVar3 = *(uint *)((long)pEVar1 + (long)*(int *)(pEVar1 + 1) * -4);
    if (0xf < uVar3 && (uVar3 & 3) == 0) {
      uVar3 = Emb_ManComputeDistance_old(p,pEVar1);
      iVar10 = 0xabd2aa;
      printf("%d ",(ulong)uVar3);
      iVar4 = iVar4 + 1;
    }
    if (0x13 < iVar4) {
      Abc_Print(iVar10,"%s =","Time");
      iVar7 = 3;
      iVar4 = clock_gettime(3,&local_38);
      if (iVar4 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
      iVar4 = clock_gettime(3,&local_38);
      if (iVar4 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_38.tv_sec * -1000000;
      }
      printf("From nodes: ");
      iVar4 = 0;
      do {
        iVar10 = 0;
        uVar5 = Gia_ManRandom(0);
        uVar3 = p->pGia->nObjs;
        uVar6 = (ulong)uVar5 % (ulong)uVar3;
        iVar7 = (int)uVar6;
        if ((iVar7 < 0) || ((int)uVar3 <= iVar7)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar6 = (ulong)p->pGia->pObjs[uVar6].Value;
        if ((uVar6 != 0xffffffff) && (uVar3 = p->pObjData[uVar6], 0xf < uVar3 && (uVar3 & 3) == 0))
        {
          uVar3 = Emb_ManComputeDistance_old(p,(Emb_Obj_t *)(p->pObjData + uVar6));
          iVar10 = 0xabd2aa;
          printf("%d ",(ulong)uVar3);
          iVar4 = iVar4 + 1;
        }
      } while (iVar4 < 0x14);
      Abc_Print(iVar10,"%s =","Time");
      iVar7 = 3;
      iVar4 = clock_gettime(3,&local_38);
      if (iVar4 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
      }
      Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar9 + lVar8) / 1000000.0);
      return;
    }
  }
LAB_0072280f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManTestDistanceInternal( Emb_Man_t * p )
{
    int nAttempts = 20;
    int i, iNode, Dist;
    abctime clk;
    Emb_Obj_t * pPivot, * pNext;
    Gia_ManRandom( 1 );
    Emb_ManResetTravId( p );
    // compute distances from several randomly selected PIs
    clk = Abc_Clock();
    printf( "From inputs: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Emb_ManCiNum(p);
        pPivot = Emb_ManCi( p, iNode );
        if ( Emb_ObjFanoutNum(pPivot) == 0 )
            { i--; continue; }
        pNext = Emb_ObjFanout( pPivot, 0 );
        if ( !Emb_ObjIsNode(pNext) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    // compute distances from several randomly selected POs
    clk = Abc_Clock();
    printf( "From outputs: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Emb_ManCoNum(p);
        pPivot = Emb_ManCo( p, iNode );
        pNext = Emb_ObjFanin( pPivot, 0 );
        if ( !Emb_ObjIsNode(pNext) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
    // compute distances from several randomly selected nodes
    clk = Abc_Clock();
    printf( "From nodes: " );
    for ( i = 0; i < nAttempts; i++ )
    {
        iNode = Gia_ManRandom( 0 ) % Gia_ManObjNum(p->pGia);
        if ( !~Gia_ManObj(p->pGia, iNode)->Value )
            { i--; continue; }
        pPivot = Emb_ManObj( p, Gia_ManObj(p->pGia, iNode)->Value );
        if ( !Emb_ObjIsNode(pPivot) )
            { i--; continue; }
        Dist = Emb_ManComputeDistance_old( p, pPivot );
        printf( "%d ", Dist );
    }
    ABC_PRT( "Time", Abc_Clock() - clk );
}